

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_byte pVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  png_byte pVar5;
  png_byte pVar6;
  png_byte pVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  png_bytep ppVar12;
  png_colorp ppVar13;
  png_voidp pvVar14;
  png_colorp ppVar15;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int d_2;
  int dmax;
  int db;
  int d_index_1;
  int index_g;
  int dm;
  int dt;
  int dg;
  int index_r;
  int dr;
  int b;
  int g;
  int r;
  int ib;
  int ig;
  int ir;
  png_size_t num_entries;
  int num_blue;
  int num_green;
  int num_red;
  int total_bits;
  png_bytep distance;
  png_dsort *ppStack_a8;
  int i_3;
  png_dsortp p_1;
  uint local_98;
  int k_1;
  int next_j;
  int j_4;
  png_dsortp p;
  int d_1;
  int j_3;
  png_dsortpp hash;
  png_dsortp t_1;
  int local_68;
  int num_new_palette;
  int max_d;
  int i_2;
  int d;
  int d_index;
  int min_k;
  int k;
  int min_d;
  int iStack_44;
  png_color tmp_color;
  int j_2;
  int j_1;
  png_byte t;
  int j;
  int done;
  int i_1;
  int i;
  int full_quantize_local;
  png_const_uint_16p histogram_local;
  int maximum_colors_local;
  int num_palette_local;
  png_colorp palette_local;
  png_structrp png_ptr_local;
  
  iVar8 = png_rtran_ok(png_ptr,0);
  if (iVar8 != 0) {
    png_ptr->transformations = png_ptr->transformations | 0x40;
    if (full_quantize == 0) {
      ppVar12 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
      png_ptr->quantize_index = ppVar12;
      for (done = 0; done < num_palette; done = done + 1) {
        png_ptr->quantize_index[done] = (png_byte)done;
      }
    }
    histogram_local._4_4_ = num_palette;
    if (maximum_colors < num_palette) {
      histogram_local._4_4_ = maximum_colors;
      if (histogram == (png_const_uint_16p)0x0) {
        hash = (png_dsortpp)0x0;
        ppVar12 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
        png_ptr->index_to_palette = ppVar12;
        ppVar12 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
        png_ptr->palette_to_index = ppVar12;
        for (num_new_palette = 0; num_new_palette < num_palette;
            num_new_palette = num_new_palette + 1) {
          png_ptr->index_to_palette[num_new_palette] = (png_byte)num_new_palette;
          png_ptr->palette_to_index[num_new_palette] = (png_byte)num_new_palette;
        }
        pvVar14 = png_calloc(png_ptr,0x1808);
        local_68 = 0x60;
        t_1._4_4_ = num_palette;
        while (maximum_colors < (int)t_1._4_4_) {
          for (num_new_palette = 0; p._4_4_ = num_new_palette,
              num_new_palette < (int)(t_1._4_4_ - 1); num_new_palette = num_new_palette + 1) {
            while (p._4_4_ = p._4_4_ + 1, p._4_4_ < (int)t_1._4_4_) {
              iVar8 = (uint)palette[num_new_palette].red - (uint)palette[p._4_4_].red;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              iVar9 = (uint)palette[num_new_palette].green - (uint)palette[p._4_4_].green;
              if (iVar9 < 1) {
                iVar9 = -iVar9;
              }
              iVar10 = (uint)palette[num_new_palette].blue - (uint)palette[p._4_4_].blue;
              if (iVar10 < 1) {
                iVar10 = -iVar10;
              }
              iVar10 = iVar8 + iVar9 + iVar10;
              if (iVar10 <= local_68) {
                hash = (png_dsortpp)png_malloc_warn(png_ptr,0x10);
                if (hash == (png_dsortpp)0x0) break;
                *hash = *(png_dsort **)((long)pvVar14 + (long)iVar10 * 8);
                *(char *)(hash + 1) = (char)num_new_palette;
                *(char *)((long)hash + 9) = (char)p._4_4_;
                *(png_dsortpp *)((long)pvVar14 + (long)iVar10 * 8) = hash;
              }
            }
            if (hash == (png_dsortpp)0x0) break;
          }
          if (hash != (png_dsortpp)0x0) {
            for (num_new_palette = 0; num_new_palette <= local_68;
                num_new_palette = num_new_palette + 1) {
              if (*(long *)((long)pvVar14 + (long)num_new_palette * 8) != 0) {
                for (_next_j = *(undefined8 **)((long)pvVar14 + (long)num_new_palette * 8);
                    _next_j != (undefined8 *)0x0; _next_j = (undefined8 *)*_next_j) {
                  if (((int)(uint)png_ptr->index_to_palette[*(byte *)(_next_j + 1)] < (int)t_1._4_4_
                      ) && ((int)(uint)png_ptr->index_to_palette[*(byte *)((long)_next_j + 9)] <
                            (int)t_1._4_4_)) {
                    if ((t_1._4_4_ & 1) == 0) {
                      bVar2 = *(byte *)((long)_next_j + 9);
                      bVar3 = *(byte *)(_next_j + 1);
                    }
                    else {
                      bVar2 = *(byte *)(_next_j + 1);
                      bVar3 = *(byte *)((long)_next_j + 9);
                    }
                    k_1 = (int)bVar2;
                    local_98 = (uint)bVar3;
                    t_1._4_4_ = t_1._4_4_ - 1;
                    ppVar13 = palette + png_ptr->index_to_palette[k_1];
                    ppVar15 = palette + (int)t_1._4_4_;
                    pVar1 = ppVar15->green;
                    ppVar13->red = ppVar15->red;
                    ppVar13->green = pVar1;
                    ppVar13->blue = ppVar15->blue;
                    if (full_quantize == 0) {
                      for (p_1._4_4_ = 0; p_1._4_4_ < num_palette; p_1._4_4_ = p_1._4_4_ + 1) {
                        if (png_ptr->quantize_index[p_1._4_4_] == png_ptr->index_to_palette[k_1]) {
                          png_ptr->quantize_index[p_1._4_4_] =
                               png_ptr->index_to_palette[(int)local_98];
                        }
                        if (png_ptr->quantize_index[p_1._4_4_] == t_1._4_4_) {
                          png_ptr->quantize_index[p_1._4_4_] = png_ptr->index_to_palette[k_1];
                        }
                      }
                    }
                    png_ptr->index_to_palette[png_ptr->palette_to_index[(int)t_1._4_4_]] =
                         png_ptr->index_to_palette[k_1];
                    png_ptr->palette_to_index[png_ptr->index_to_palette[k_1]] =
                         png_ptr->palette_to_index[(int)t_1._4_4_];
                    png_ptr->index_to_palette[k_1] = (png_byte)t_1._4_4_;
                    png_ptr->palette_to_index[(int)t_1._4_4_] = bVar2;
                  }
                  if ((int)t_1._4_4_ <= maximum_colors) break;
                }
                if ((int)t_1._4_4_ <= maximum_colors) break;
              }
            }
          }
          for (num_new_palette = 0; num_new_palette < 0x301; num_new_palette = num_new_palette + 1)
          {
            if (*(long *)((long)pvVar14 + (long)num_new_palette * 8) != 0) {
              ppStack_a8 = (png_dsort *)*(png_dsortpp *)((long)pvVar14 + (long)num_new_palette * 8);
              while (ppStack_a8 != (png_dsort *)0x0) {
                hash = *(png_dsortpp *)ppStack_a8;
                png_free(png_ptr,ppStack_a8);
                ppStack_a8 = (png_dsort *)hash;
              }
            }
            *(undefined8 *)((long)pvVar14 + (long)num_new_palette * 8) = 0;
          }
          local_68 = local_68 + 0x60;
        }
        png_free(png_ptr,pvVar14);
        png_free(png_ptr,png_ptr->palette_to_index);
        png_free(png_ptr,png_ptr->index_to_palette);
        png_ptr->palette_to_index = (png_bytep)0x0;
        png_ptr->index_to_palette = (png_bytep)0x0;
      }
      else {
        ppVar12 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
        png_ptr->quantize_sort = ppVar12;
        for (j = 0; j < num_palette; j = j + 1) {
          png_ptr->quantize_sort[j] = (png_byte)j;
        }
        for (j = num_palette + -1; maximum_colors <= j; j = j + -1) {
          bVar4 = true;
          for (j_1 = 0; j_1 < j; j_1 = j_1 + 1) {
            if (histogram[png_ptr->quantize_sort[j_1]] < histogram[png_ptr->quantize_sort[j_1 + 1]])
            {
              pVar1 = png_ptr->quantize_sort[j_1];
              png_ptr->quantize_sort[j_1] = png_ptr->quantize_sort[j_1 + 1];
              png_ptr->quantize_sort[j_1 + 1] = pVar1;
              bVar4 = false;
            }
          }
          if (bVar4) break;
        }
        if (full_quantize == 0) {
          min_d = num_palette;
          for (j = 0; j < maximum_colors; j = j + 1) {
            if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[j]) {
              do {
                min_d = min_d + -1;
              } while (maximum_colors <= (int)(uint)png_ptr->quantize_sort[min_d]);
              ppVar13 = palette + min_d;
              pVar6 = ppVar13->red;
              pVar7 = ppVar13->green;
              pVar1 = ppVar13->blue;
              ppVar13 = palette + min_d;
              ppVar15 = palette + j;
              pVar5 = ppVar15->green;
              ppVar13->red = ppVar15->red;
              ppVar13->green = pVar5;
              ppVar13->blue = ppVar15->blue;
              ppVar13 = palette + j;
              ppVar13->red = pVar6;
              ppVar13->green = pVar7;
              ppVar13->blue = pVar1;
              png_ptr->quantize_index[min_d] = (png_byte)j;
              png_ptr->quantize_index[j] = (png_byte)min_d;
            }
          }
          for (j = 0; j < num_palette; j = j + 1) {
            if (maximum_colors <= (int)(uint)png_ptr->quantize_index[j]) {
              uVar11 = (uint)png_ptr->quantize_index[j];
              iVar8 = (uint)palette[(int)uVar11].red - (uint)palette->red;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              iVar9 = (uint)palette[(int)uVar11].green - (uint)palette->green;
              if (iVar9 < 1) {
                iVar9 = -iVar9;
              }
              iVar10 = (uint)palette[(int)uVar11].blue - (uint)palette->blue;
              if (iVar10 < 1) {
                iVar10 = -iVar10;
              }
              min_k = iVar8 + iVar9 + iVar10;
              d = 0;
              for (d_index = 1; d_index < maximum_colors; d_index = d_index + 1) {
                iVar8 = (uint)palette[(int)uVar11].red - (uint)palette[d_index].red;
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                iVar9 = (uint)palette[(int)uVar11].green - (uint)palette[d_index].green;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                iVar10 = (uint)palette[(int)uVar11].blue - (uint)palette[d_index].blue;
                if (iVar10 < 1) {
                  iVar10 = -iVar10;
                }
                iVar10 = iVar8 + iVar9 + iVar10;
                if (iVar10 < min_k) {
                  d = d_index;
                  min_k = iVar10;
                }
              }
              png_ptr->quantize_index[j] = (png_byte)d;
            }
          }
        }
        else {
          iStack_44 = num_palette;
          for (j = 0; j < maximum_colors; j = j + 1) {
            if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[j]) {
              do {
                iStack_44 = iStack_44 + -1;
              } while (maximum_colors <= (int)(uint)png_ptr->quantize_sort[iStack_44]);
              ppVar13 = palette + j;
              ppVar15 = palette + iStack_44;
              pVar1 = ppVar15->green;
              ppVar13->red = ppVar15->red;
              ppVar13->green = pVar1;
              ppVar13->blue = ppVar15->blue;
            }
          }
        }
        png_free(png_ptr,png_ptr->quantize_sort);
        png_ptr->quantize_sort = (png_bytep)0x0;
      }
    }
    if (png_ptr->palette == (png_colorp)0x0) {
      png_ptr->palette = palette;
    }
    png_ptr->num_palette = (png_uint_16)histogram_local._4_4_;
    if (full_quantize != 0) {
      ppVar12 = (png_bytep)png_calloc(png_ptr,0x8000);
      png_ptr->palette_lookup = ppVar12;
      pvVar14 = png_malloc(png_ptr,0x8000);
      memset(pvVar14,0xff,0x8000);
      for (distance._4_4_ = 0; distance._4_4_ < histogram_local._4_4_;
          distance._4_4_ = distance._4_4_ + 1) {
        iVar8 = (int)(uint)palette[distance._4_4_].red >> 3;
        iVar9 = (int)(uint)palette[distance._4_4_].green >> 3;
        iVar10 = (int)(uint)palette[distance._4_4_].blue >> 3;
        for (ib = 0; ib < 0x20; ib = ib + 1) {
          if (iVar8 < ib) {
            local_114 = ib - iVar8;
          }
          else {
            local_114 = iVar8 - ib;
          }
          for (r = 0; r < 0x20; r = r + 1) {
            if (iVar9 < r) {
              local_118 = r - iVar9;
            }
            else {
              local_118 = iVar9 - r;
            }
            if (local_118 < local_114) {
              local_11c = local_114;
            }
            else {
              local_11c = local_118;
            }
            for (g = 0; g < 0x20; g = g + 1) {
              uVar11 = ib << 10 | r << 5 | g;
              if (iVar10 < g) {
                local_120 = g - iVar10;
              }
              else {
                local_120 = iVar10 - g;
              }
              if (local_120 < local_11c) {
                local_124 = local_11c;
              }
              else {
                local_124 = local_120;
              }
              local_120 = local_124 + local_114 + local_118 + local_120;
              if (local_120 < (int)(uint)*(byte *)((long)pvVar14 + (long)(int)uVar11)) {
                *(char *)((long)pvVar14 + (long)(int)uVar11) = (char)local_120;
                png_ptr->palette_lookup[(int)uVar11] = (png_byte)distance._4_4_;
              }
            }
          }
        }
      }
      png_free(png_ptr,pvVar14);
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_uint_32)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_uint_32)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      png_size_t num_entries = ((png_size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_uint_32)(num_entries * (sizeof (png_byte))));

      distance = (png_bytep)png_malloc(png_ptr, (png_uint_32)(num_entries *
          (sizeof (png_byte))));

      memset(distance, 0xff, num_entries * (sizeof (png_byte)));

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}